

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O0

size_t BrotliZopfliComputeShortestPath
                 (MemoryManager *m,size_t num_bytes,size_t position,uint8_t *ringbuffer,
                 size_t ringbuffer_mask,ContextLut literal_context_lut,BrotliEncoderParams *params,
                 int *dist_cache,Hasher *hasher,ZopfliNode *nodes)

{
  uint uVar1;
  BackwardMatch *pBVar2;
  uint uVar3;
  int iVar4;
  ulong max_backward_limit_00;
  ulong uVar5;
  ulong uVar6;
  size_t pos_00;
  size_t sVar7;
  ulong uVar8;
  size_t local_21b0;
  size_t local_2198;
  ulong local_2188;
  ulong local_2160;
  uint local_2158;
  ulong local_2148;
  size_t local_2140;
  size_t local_2130;
  ulong local_2128;
  ulong local_2118;
  ulong local_2110;
  ulong local_2108;
  size_t local_2100;
  size_t num_matches;
  size_t skip;
  size_t dictionary_start;
  size_t max_distance;
  size_t pos;
  size_t lz_matches_offset;
  size_t gap;
  size_t i;
  size_t store_end;
  BackwardMatch matches [384];
  StartPosQueue queue;
  ZopfliCostModel model;
  size_t max_zopfli_len;
  size_t max_backward_limit;
  size_t stream_offset;
  ContextLut literal_context_lut_local;
  size_t ringbuffer_mask_local;
  uint8_t *ringbuffer_local;
  size_t position_local;
  size_t num_bytes_local;
  MemoryManager *m_local;
  size_t distance;
  ulong uStack_7f0;
  uint32_t dict_id;
  size_t l;
  size_t maxlen;
  size_t minlen;
  size_t len;
  size_t backward;
  size_t prev_ix;
  size_t i_1;
  uint32_t dict_matches [38];
  ulong local_718;
  size_t stop;
  size_t short_match_max_backward;
  size_t best_len;
  size_t cur_ix_masked;
  BackwardMatch *orig_matches;
  BrotliEncoderParams *local_6e8;
  ulong local_6e0;
  ulong local_6d8;
  ulong local_6d0;
  ulong local_6c8;
  size_t local_6c0;
  uint8_t *local_6b8;
  BrotliEncoderDictionary *local_6b0;
  anon_union_1048_13_a959428b_for_privat *local_6a8;
  ulong local_6a0;
  undefined8 local_698;
  size_t *local_690;
  size_t *local_688;
  BackwardMatch *local_680;
  ulong local_678;
  undefined8 local_670;
  size_t local_668;
  ulong local_660;
  ulong local_658;
  size_t j;
  size_t i_2;
  ulong local_640;
  ulong local_638;
  uint8_t *local_630;
  anon_union_1048_13_a959428b_for_privat *local_628;
  ulong local_620;
  size_t matching_bits;
  uint64_t x;
  size_t limit2;
  size_t matched;
  ulong *local_5f8;
  uint8_t *local_5f0;
  size_t local_5e8;
  ulong local_5e0;
  ulong local_5d8;
  BackwardMatch *local_5d0;
  ulong local_5c8;
  size_t len_1;
  size_t cur_len;
  size_t prev_ix_masked;
  size_t backward_1;
  size_t depth_remaining;
  size_t best_len_right;
  size_t best_len_left;
  size_t node_right;
  size_t node_left;
  size_t prev_ix_1;
  uint32_t *forest;
  uint32_t *buckets;
  uint32_t key;
  int should_reroot_tree;
  size_t max_comp_len;
  size_t cur_ix_masked_1;
  ulong *local_548;
  ulong local_540;
  ulong local_538;
  size_t local_530;
  ulong local_528;
  uint8_t *local_520;
  anon_union_1048_13_a959428b_for_privat *local_518;
  size_t local_510;
  size_t local_508;
  undefined8 local_500;
  ulong local_4f8;
  ulong local_4f0;
  size_t matching_bits_1;
  uint64_t x_1;
  size_t limit2_1;
  size_t matched_1;
  ulong *local_4c8;
  uint8_t *local_4c0;
  size_t local_4b8;
  ulong local_4b0;
  size_t local_4a8;
  size_t local_4a0;
  ulong local_498;
  ulong local_490;
  ulong local_488;
  BackwardMatch *local_480;
  ulong *local_478;
  ulong *local_470;
  ulong *local_468;
  ulong *local_460;
  ulong *local_458;
  ulong *local_450;
  ulong *local_448;
  ulong *local_440;
  size_t local_438;
  anon_union_1048_13_a959428b_for_privat *local_430;
  size_t local_428;
  anon_union_1048_13_a959428b_for_privat *local_420;
  ulong local_418;
  anon_union_1048_13_a959428b_for_privat *local_410;
  size_t local_408;
  anon_union_1048_13_a959428b_for_privat *local_400;
  size_t local_3f8;
  anon_union_1048_13_a959428b_for_privat *local_3f0;
  ulong local_3e8;
  anon_union_1048_13_a959428b_for_privat *local_3e0;
  ulong local_3d8;
  size_t max_backward;
  ulong local_3c8;
  uint8_t *local_3c0;
  anon_union_1048_13_a959428b_for_privat *local_3b8;
  ulong local_3b0;
  size_t len_2;
  size_t cur_len_1;
  size_t prev_ix_masked_1;
  size_t backward_2;
  size_t depth_remaining_1;
  size_t best_len_right_1;
  size_t best_len_left_1;
  size_t node_right_1;
  size_t node_left_1;
  size_t prev_ix_2;
  uint32_t *forest_1;
  uint32_t *buckets_1;
  uint32_t key_1;
  int should_reroot_tree_1;
  size_t max_comp_len_1;
  size_t cur_ix_masked_2;
  ulong *local_330;
  ulong local_328;
  long local_320;
  ulong local_318;
  ulong local_310;
  uint8_t *local_308;
  anon_union_1048_13_a959428b_for_privat *local_300;
  size_t local_2f8;
  size_t local_2f0;
  undefined8 local_2e8;
  undefined8 local_2e0;
  ulong local_2d8;
  size_t matching_bits_2;
  uint64_t x_2;
  size_t limit2_2;
  size_t matched_2;
  ulong *local_2b0;
  uint8_t *local_2a8;
  size_t local_2a0;
  ulong local_298;
  ulong local_290;
  size_t local_288;
  ulong *local_280;
  ulong *local_278;
  ulong *local_270;
  ulong *local_268;
  size_t local_260;
  anon_union_1048_13_a959428b_for_privat *local_258;
  size_t local_250;
  anon_union_1048_13_a959428b_for_privat *local_248;
  ulong local_240;
  anon_union_1048_13_a959428b_for_privat *local_238;
  size_t local_230;
  anon_union_1048_13_a959428b_for_privat *local_228;
  size_t local_220;
  anon_union_1048_13_a959428b_for_privat *local_218;
  ulong local_210;
  anon_union_1048_13_a959428b_for_privat *local_208;
  ulong local_200;
  size_t max_backward_1;
  ulong local_1f0;
  uint8_t *local_1e8;
  anon_union_1048_13_a959428b_for_privat *local_1e0;
  ulong local_1d8;
  size_t len_3;
  size_t cur_len_2;
  size_t prev_ix_masked_2;
  size_t backward_3;
  size_t depth_remaining_2;
  size_t best_len_right_2;
  size_t best_len_left_2;
  size_t node_right_2;
  size_t node_left_2;
  size_t prev_ix_3;
  uint32_t *forest_2;
  uint32_t *buckets_2;
  uint32_t key_2;
  int should_reroot_tree_2;
  size_t max_comp_len_2;
  size_t cur_ix_masked_3;
  ulong *local_158;
  ulong local_150;
  long local_148;
  ulong local_140;
  size_t local_138;
  uint8_t *local_130;
  anon_union_1048_13_a959428b_for_privat *local_128;
  size_t local_120;
  size_t local_118;
  undefined8 local_110;
  undefined8 local_108;
  ulong local_100;
  size_t matching_bits_3;
  uint64_t x_3;
  size_t limit2_3;
  size_t matched_3;
  ulong *local_d8;
  uint8_t *local_d0;
  size_t local_c8;
  ulong local_c0;
  ulong local_b8;
  size_t local_b0;
  ulong *local_a8;
  ulong *local_a0;
  ulong *local_98;
  ulong *local_90;
  size_t local_88;
  anon_union_1048_13_a959428b_for_privat *local_80;
  size_t local_78;
  anon_union_1048_13_a959428b_for_privat *local_70;
  ulong local_68;
  anon_union_1048_13_a959428b_for_privat *local_60;
  size_t local_58;
  anon_union_1048_13_a959428b_for_privat *local_50;
  size_t local_48;
  anon_union_1048_13_a959428b_for_privat *local_40;
  ulong local_38;
  anon_union_1048_13_a959428b_for_privat *local_30;
  
  sVar7 = params->stream_offset;
  max_backward_limit_00 = (1L << ((byte)params->lgwin & 0x3f)) - 0x10;
  uVar3 = 0x145;
  if (params->quality < 0xb) {
    uVar3 = 0x96;
  }
  local_2108 = position;
  if (0x7f < num_bytes) {
    local_2108 = (position + num_bytes) - 0x7f;
  }
  nodes->length = 0;
  (nodes->u).cost = 0.0;
  InitZopfliCostModel(m,(ZopfliCostModel *)&queue.idx_,&params->dist,num_bytes);
  ZopfliCostModelSetFromLiteralCosts
            ((ZopfliCostModel *)&queue.idx_,position,ringbuffer,ringbuffer_mask);
  queue.q_[7].costdiff = 0.0;
  queue.q_[7].cost = 0.0;
  gap = 0;
  do {
    if (num_bytes <= gap + 3) {
      CleanupZopfliCostModel(m,(ZopfliCostModel *)&queue.idx_);
      sVar7 = ComputeShortestPathFromNodes(num_bytes,nodes);
      return sVar7;
    }
    uVar5 = position + gap;
    local_2110 = max_backward_limit_00;
    if (uVar5 < max_backward_limit_00) {
      local_2110 = uVar5;
    }
    uVar8 = uVar5 + sVar7;
    local_2118 = max_backward_limit_00;
    if (uVar8 < max_backward_limit_00) {
      local_2118 = uVar8;
    }
    local_6a8 = &hasher->privat;
    local_6b0 = &params->dictionary;
    local_6d0 = num_bytes - gap;
    local_6e0 = local_2118;
    cur_ix_masked = (size_t)&store_end;
    local_6d8 = local_2110;
    local_6e8 = params;
    best_len = uVar5 & ringbuffer_mask;
    short_match_max_backward = 1;
    iVar4 = 0x40;
    if (params->quality != 0xb) {
      iVar4 = 0x10;
    }
    local_718 = uVar5 - (long)iVar4;
    orig_matches = (BackwardMatch *)cur_ix_masked;
    prev_ix = uVar5;
    if (uVar5 < (ulong)(long)iVar4) {
      local_718 = 0;
      orig_matches = (BackwardMatch *)cur_ix_masked;
    }
    while ((prev_ix = prev_ix - 1, local_718 < prev_ix && short_match_max_backward < 3 &&
           (uVar8 = uVar5 - prev_ix, uVar8 <= local_2110))) {
      uVar6 = ringbuffer_mask & prev_ix;
      if ((ringbuffer[best_len] == ringbuffer[uVar6]) &&
         (ringbuffer[best_len + 1] == ringbuffer[uVar6 + 1])) {
        local_5f0 = ringbuffer + uVar6;
        local_5f8 = (ulong *)(ringbuffer + best_len);
        limit2 = 0;
        x = (local_6d0 >> 3) + 1;
LAB_00156937:
        x = x - 1;
        if (x != 0) {
          local_440 = local_5f8;
          local_448 = (ulong *)(local_5f0 + limit2);
          if (*local_5f8 == *local_448) goto LAB_00156999;
          local_450 = local_5f8;
          local_458 = (ulong *)(local_5f0 + limit2);
          iVar4 = 0;
          matching_bits = *local_5f8 ^ *local_458;
          for (uVar6 = matching_bits; (uVar6 & 1) == 0; uVar6 = uVar6 >> 1 | 0x8000000000000000) {
            iVar4 = iVar4 + 1;
          }
          local_620 = (ulong)iVar4;
          local_5e8 = (local_620 >> 3) + limit2;
          matched = local_6d0;
          goto LAB_00156ada;
        }
        matched = (local_6d0 & 7) + 1;
        while (matched = matched - 1, matched != 0) {
          if (local_5f0[limit2] != (uint8_t)*local_5f8) {
            local_5e8 = limit2;
            goto LAB_00156ada;
          }
          local_5f8 = (ulong *)((long)local_5f8 + 1);
          limit2 = limit2 + 1;
        }
        local_5e8 = limit2;
LAB_00156ada:
        limit2 = local_5e8;
        if (short_match_max_backward < local_5e8) {
          short_match_max_backward = local_5e8;
          local_5d0 = orig_matches;
          local_5e0 = local_5e8;
          orig_matches->distance = (uint32_t)uVar8;
          orig_matches->length_and_code = (uint32_t)(local_5e8 << 5);
          orig_matches = orig_matches + 1;
          local_5d8 = uVar8;
        }
      }
    }
    local_6c8 = uVar5;
    local_6c0 = ringbuffer_mask;
    local_6b8 = ringbuffer;
    if (short_match_max_backward < local_6d0) {
      local_540 = local_2110;
      local_548 = &short_match_max_backward;
      cur_ix_masked_1 = (size_t)orig_matches;
      max_comp_len = uVar5 & ringbuffer_mask;
      local_500 = 0x80;
      local_2128 = local_6d0;
      if (0x7f < local_6d0) {
        local_2128 = 0x80;
      }
      _key = local_2128;
      buckets._4_4_ = (uint)(0x7f < local_6d0);
      local_538 = local_6d0;
      local_530 = ringbuffer_mask;
      local_528 = uVar5;
      local_520 = ringbuffer;
      local_518 = local_6a8;
      local_4f8 = local_6d0;
      buckets._0_4_ = HashBytesH10(ringbuffer + max_comp_len);
      forest = (local_518->_H2).buckets_;
      prev_ix_1 = (local_518->_H65).ha.hash_mask_;
      uVar1 = forest[(uint32_t)buckets];
      local_410 = local_518;
      local_418 = local_528;
      node_right = (local_528 & (local_518->_H5).bucket_size_) << 1;
      local_3e0 = local_518;
      local_3e8 = local_528;
      best_len_left = (local_528 & (local_518->_H5).bucket_size_) * 2 + 1;
      best_len_right = 0;
      depth_remaining = 0;
      if (buckets._4_4_ != 0) {
        forest[(uint32_t)buckets] = (uint32_t)local_528;
      }
      backward_1 = 0x40;
      while( true ) {
        node_left = (size_t)uVar1;
        prev_ix_masked = local_528 - node_left;
        cur_len = node_left & local_530;
        if (((prev_ix_masked == 0) || (local_540 < prev_ix_masked)) || (backward_1 == 0)) break;
        local_508 = best_len_right;
        local_510 = depth_remaining;
        if (best_len_right < depth_remaining) {
          local_2130 = best_len_right;
        }
        else {
          local_2130 = depth_remaining;
        }
        len_1 = local_2130;
        local_4c0 = local_520 + max_comp_len + local_2130;
        local_4c8 = (ulong *)(local_520 + cur_len + local_2130);
        matched_1 = local_538 - local_2130;
        limit2_1 = 0;
        x_1 = (matched_1 >> 3) + 1;
LAB_00156f01:
        x_1 = x_1 - 1;
        if (x_1 != 0) {
          local_460 = local_4c8;
          local_468 = (ulong *)(local_4c0 + limit2_1);
          if (*local_4c8 == *local_468) goto LAB_00156f63;
          local_470 = local_4c8;
          local_478 = (ulong *)(local_4c0 + limit2_1);
          iVar4 = 0;
          matching_bits_1 = *local_4c8 ^ *local_478;
          for (uVar8 = matching_bits_1; (uVar8 & 1) == 0; uVar8 = uVar8 >> 1 | 0x8000000000000000) {
            iVar4 = iVar4 + 1;
          }
          local_4f0 = (ulong)iVar4;
          local_4b8 = (local_4f0 >> 3) + limit2_1;
          goto LAB_001570a4;
        }
        matched_1 = (matched_1 & 7) + 1;
        while (matched_1 = matched_1 - 1, matched_1 != 0) {
          if (local_4c0[limit2_1] != (uint8_t)*local_4c8) {
            local_4b8 = limit2_1;
            goto LAB_001570a4;
          }
          local_4c8 = (ulong *)((long)local_4c8 + 1);
          limit2_1 = limit2_1 + 1;
        }
        local_4b8 = limit2_1;
LAB_001570a4:
        local_5c8 = local_2130 + local_4b8;
        limit2_1 = local_4b8;
        if ((cur_ix_masked_1 != 0) && (*local_548 < local_5c8)) {
          *local_548 = local_5c8;
          local_4a0 = cur_ix_masked_1;
          local_4a8 = prev_ix_masked;
          local_4b0 = local_5c8;
          *(int *)cur_ix_masked_1 = (int)prev_ix_masked;
          *(int *)(cur_ix_masked_1 + 4) = (int)(local_5c8 << 5);
          cur_ix_masked_1 = cur_ix_masked_1 + 8;
        }
        if (_key <= local_5c8) {
          if (buckets._4_4_ != 0) {
            local_430 = local_518;
            local_438 = node_left;
            *(undefined4 *)(prev_ix_1 + node_right * 4) =
                 *(undefined4 *)(prev_ix_1 + (node_left & (local_518->_H5).bucket_size_) * 8);
            local_400 = local_518;
            local_408 = node_left;
            *(undefined4 *)(prev_ix_1 + best_len_left * 4) =
                 *(undefined4 *)(prev_ix_1 + 4 + (node_left & (local_518->_H5).bucket_size_) * 8);
          }
          goto LAB_00157363;
        }
        if (local_520[cur_len + local_5c8] < local_520[max_comp_len + local_5c8]) {
          best_len_right = local_5c8;
          if (buckets._4_4_ != 0) {
            *(int *)(prev_ix_1 + node_right * 4) = (int)node_left;
          }
          local_3f0 = local_518;
          local_3f8 = node_left;
          node_right = (node_left & (local_518->_H5).bucket_size_) * 2 + 1;
          uVar1 = *(uint *)(prev_ix_1 + node_right * 4);
        }
        else {
          depth_remaining = local_5c8;
          if (buckets._4_4_ != 0) {
            *(int *)(prev_ix_1 + best_len_left * 4) = (int)node_left;
          }
          local_420 = local_518;
          local_428 = node_left;
          uVar8 = node_left & (local_518->_H5).bucket_size_;
          best_len_left = uVar8 * 2;
          uVar1 = *(uint *)(prev_ix_1 + uVar8 * 8);
        }
        backward_1 = backward_1 - 1;
      }
      if (buckets._4_4_ != 0) {
        *(int *)(prev_ix_1 + node_right * 4) = (local_518->_H5).hash_shift_;
        *(int *)(prev_ix_1 + best_len_left * 4) = (local_518->_H5).hash_shift_;
      }
LAB_00157363:
      orig_matches = (BackwardMatch *)cur_ix_masked_1;
    }
    for (prev_ix = 0; prev_ix < 0x26; prev_ix = prev_ix + 1) {
      dict_matches[prev_ix - 2] = 0xfffffff;
    }
    local_678 = short_match_max_backward + 1;
    local_670 = 4;
    local_2140 = local_678;
    if (local_678 < 4) {
      local_2140 = 4;
    }
    iVar4 = BrotliFindAllStaticDictionaryMatches
                      (local_6b0,local_6b8 + best_len,local_2140,local_6d0,(uint32_t *)&i_1);
    if (iVar4 != 0) {
      local_698 = 0x25;
      local_6a0 = local_6d0;
      if (local_6d0 < 0x26) {
        local_2148 = local_6d0;
      }
      else {
        local_2148 = 0x25;
      }
      for (uStack_7f0 = local_2140; pBVar2 = orig_matches, uStack_7f0 <= local_2148;
          uStack_7f0 = uStack_7f0 + 1) {
        local_2158 = dict_matches[uStack_7f0 - 2];
        if ((local_2158 < 0xfffffff) &&
           (uVar8 = local_6e0 + (local_2158 >> 5) + 1, uVar8 <= (local_6e8->dist).max_distance)) {
          orig_matches = orig_matches + 1;
          local_2158 = local_2158 & 0x1f;
          local_480 = pBVar2;
          local_488 = uVar8;
          local_490 = uStack_7f0;
          local_498 = (ulong)local_2158;
          pBVar2->distance = (uint32_t)uVar8;
          if (uStack_7f0 == local_2158) {
            local_2158 = 0;
          }
          pBVar2->length_and_code = (uint)(uStack_7f0 << 5) | local_2158;
        }
      }
    }
    local_2100 = (long)((long)orig_matches - cur_ix_masked) >> 3;
    if ((local_2100 != 0) &&
       (local_680 = matches + (local_2100 - 2), uVar3 < matches[local_2100 - 2].length_and_code >> 5
       )) {
      store_end = *(size_t *)(matches + (local_2100 - 2));
      local_2100 = 1;
    }
    num_matches = UpdateNodes(num_bytes,position,gap,ringbuffer,ringbuffer_mask,params,
                              max_backward_limit_00,dist_cache,local_2100,
                              (BackwardMatch *)&store_end,(ZopfliCostModel *)&queue.idx_,
                              (StartPosQueue *)(matches + 0x17f),nodes);
    if (num_matches < 0x4000) {
      num_matches = 0;
    }
    if (local_2100 == 1) {
      local_688 = &store_end;
      if (uVar3 < store_end._4_4_ >> 5) {
        local_690 = &store_end;
        local_660 = (ulong)(store_end._4_4_ >> 5);
        local_668 = num_matches;
        local_2160 = local_660;
        if (local_660 <= num_matches) {
          local_2160 = num_matches;
        }
        num_matches = local_2160;
      }
    }
    if (1 < num_matches) {
      local_628 = &hasher->privat;
      local_658 = uVar5 + 1;
      local_2188 = uVar5 + num_matches;
      if (local_2108 <= local_2188) {
        local_2188 = local_2108;
      }
      i_2 = local_2188;
      j = local_658;
      if (uVar5 + 0x40 <= local_2188) {
        j = local_2188 - 0x3f;
      }
      local_640 = local_658;
      local_638 = ringbuffer_mask;
      local_630 = ringbuffer;
      if (uVar5 + 0x201 <= j) {
        for (; local_658 < j; local_658 = local_658 + 8) {
          local_3b8 = local_628;
          local_3c0 = local_630;
          local_3c8 = local_638;
          max_backward = local_658;
          local_3d8 = (local_628->_H5).bucket_size_ - 0xf;
          local_300 = local_628;
          local_308 = local_630;
          local_310 = local_658;
          local_318 = local_638;
          local_320 = 0x80;
          local_330 = (ulong *)0x0;
          cur_ix_masked_2 = 0;
          max_comp_len_1 = local_658 & local_638;
          local_2e0 = 0x80;
          local_2e8 = 0x80;
          _key_1 = 0x80;
          buckets_1._4_4_ = 1;
          local_328 = local_3d8;
          buckets_1._0_4_ = HashBytesH10(local_630 + max_comp_len_1);
          forest_1 = (local_300->_H2).buckets_;
          prev_ix_2 = (size_t)(local_300->_H40).common;
          uVar1 = forest_1[(uint32_t)buckets_1];
          local_238 = local_300;
          local_240 = local_310;
          node_right_1 = (local_310 & (local_300->_H5).bucket_size_) << 1;
          local_208 = local_300;
          local_210 = local_310;
          best_len_left_1 = (local_310 & (local_300->_H5).bucket_size_) * 2 + 1;
          best_len_right_1 = 0;
          depth_remaining_1 = 0;
          if (buckets_1._4_4_ != 0) {
            forest_1[(uint32_t)buckets_1] = (uint32_t)local_310;
          }
          backward_2 = 0x40;
          while( true ) {
            node_left_1 = (size_t)uVar1;
            prev_ix_masked_1 = local_310 - node_left_1;
            cur_len_1 = node_left_1 & local_318;
            if (((prev_ix_masked_1 == 0) || (local_328 < prev_ix_masked_1)) || (backward_2 == 0))
            break;
            local_2f0 = best_len_right_1;
            local_2f8 = depth_remaining_1;
            if (best_len_right_1 < depth_remaining_1) {
              local_2198 = best_len_right_1;
            }
            else {
              local_2198 = depth_remaining_1;
            }
            len_2 = local_2198;
            local_2a8 = local_308 + max_comp_len_1 + local_2198;
            local_2b0 = (ulong *)(local_308 + cur_len_1 + local_2198);
            matched_2 = local_320 - local_2198;
            limit2_2 = 0;
            x_2 = (matched_2 >> 3) + 1;
LAB_00157ca7:
            x_2 = x_2 - 1;
            if (x_2 != 0) {
              local_268 = local_2b0;
              local_270 = (ulong *)(local_2a8 + limit2_2);
              if (*local_2b0 == *local_270) goto LAB_00157d09;
              local_278 = local_2b0;
              local_280 = (ulong *)(local_2a8 + limit2_2);
              iVar4 = 0;
              matching_bits_2 = *local_2b0 ^ *local_280;
              for (uVar5 = matching_bits_2; (uVar5 & 1) == 0;
                  uVar5 = uVar5 >> 1 | 0x8000000000000000) {
                iVar4 = iVar4 + 1;
              }
              local_2d8 = (ulong)iVar4;
              local_2a0 = (local_2d8 >> 3) + limit2_2;
              goto LAB_00157e4a;
            }
            matched_2 = (matched_2 & 7) + 1;
            while (matched_2 = matched_2 - 1, matched_2 != 0) {
              if (local_2a8[limit2_2] != (uint8_t)*local_2b0) {
                local_2a0 = limit2_2;
                goto LAB_00157e4a;
              }
              local_2b0 = (ulong *)((long)local_2b0 + 1);
              limit2_2 = limit2_2 + 1;
            }
            local_2a0 = limit2_2;
LAB_00157e4a:
            local_3b0 = local_2198 + local_2a0;
            if ((cur_ix_masked_2 != 0) && (*local_330 < local_3b0)) {
              *local_330 = local_3b0;
              local_288 = cur_ix_masked_2;
              *(int *)cur_ix_masked_2 = (int)prev_ix_masked_1;
              *(int *)(cur_ix_masked_2 + 4) = (int)local_3b0 * 0x20;
              cur_ix_masked_2 = cur_ix_masked_2 + 8;
              local_298 = local_3b0;
              local_290 = prev_ix_masked_1;
            }
            limit2_2 = local_2a0;
            if (_key_1 <= local_3b0) {
              if (buckets_1._4_4_ != 0) {
                local_258 = local_300;
                local_260 = node_left_1;
                *(undefined4 *)((long)&((HasherCommon *)prev_ix_2)->extra + node_right_1 * 4) =
                     *(undefined4 *)
                      (&((HasherCommon *)prev_ix_2)->extra +
                      (node_left_1 & (local_300->_H5).bucket_size_));
                local_228 = local_300;
                local_230 = node_left_1;
                *(undefined4 *)((long)&((HasherCommon *)prev_ix_2)->extra + best_len_left_1 * 4) =
                     *(undefined4 *)
                      ((long)&((HasherCommon *)prev_ix_2)->extra +
                      (node_left_1 & (local_300->_H5).bucket_size_) * 8 + 4);
              }
              goto LAB_00158109;
            }
            if (local_308[cur_len_1 + local_3b0] < local_308[max_comp_len_1 + local_3b0]) {
              if (buckets_1._4_4_ != 0) {
                *(uint *)((long)&((HasherCommon *)prev_ix_2)->extra + node_right_1 * 4) = uVar1;
              }
              local_218 = local_300;
              local_220 = node_left_1;
              uVar5 = node_left_1 & (local_300->_H5).bucket_size_;
              node_right_1 = uVar5 * 2 + 1;
              uVar1 = *(uint *)((long)&((HasherCommon *)prev_ix_2)->extra + uVar5 * 8 + 4);
              best_len_right_1 = local_3b0;
            }
            else {
              if (buckets_1._4_4_ != 0) {
                *(uint *)((long)&((HasherCommon *)prev_ix_2)->extra + best_len_left_1 * 4) = uVar1;
              }
              local_248 = local_300;
              local_250 = node_left_1;
              uVar5 = node_left_1 & (local_300->_H5).bucket_size_;
              best_len_left_1 = uVar5 * 2;
              uVar1 = *(uint *)(&((HasherCommon *)prev_ix_2)->extra + uVar5);
              depth_remaining_1 = local_3b0;
            }
            backward_2 = backward_2 - 1;
          }
          if (buckets_1._4_4_ != 0) {
            *(int *)((long)&((HasherCommon *)prev_ix_2)->extra + node_right_1 * 4) =
                 (local_300->_H5).hash_shift_;
            *(int *)((long)&((HasherCommon *)prev_ix_2)->extra + best_len_left_1 * 4) =
                 (local_300->_H5).hash_shift_;
          }
LAB_00158109:
        }
      }
      for (; j < i_2; j = j + 1) {
        local_1e0 = local_628;
        local_1e8 = local_630;
        local_1f0 = local_638;
        max_backward_1 = j;
        local_200 = (local_628->_H5).bucket_size_ - 0xf;
        local_128 = local_628;
        local_130 = local_630;
        local_138 = j;
        local_140 = local_638;
        local_148 = 0x80;
        local_158 = (ulong *)0x0;
        cur_ix_masked_3 = 0;
        max_comp_len_2 = j & local_638;
        local_108 = 0x80;
        local_110 = 0x80;
        _key_2 = 0x80;
        buckets_2._4_4_ = 1;
        local_150 = local_200;
        buckets_2._0_4_ = HashBytesH10(local_630 + max_comp_len_2);
        forest_2 = (local_128->_H2).buckets_;
        prev_ix_3 = (size_t)(local_128->_H40).common;
        uVar1 = forest_2[(uint32_t)buckets_2];
        local_60 = local_128;
        local_68 = local_138;
        node_right_2 = (local_138 & (local_128->_H5).bucket_size_) << 1;
        local_30 = local_128;
        local_38 = local_138;
        best_len_left_2 = (local_138 & (local_128->_H5).bucket_size_) * 2 + 1;
        best_len_right_2 = 0;
        depth_remaining_2 = 0;
        if (buckets_2._4_4_ != 0) {
          forest_2[(uint32_t)buckets_2] = (uint32_t)local_138;
        }
        backward_3 = 0x40;
        while( true ) {
          node_left_2 = (size_t)uVar1;
          prev_ix_masked_2 = local_138 - node_left_2;
          cur_len_2 = node_left_2 & local_140;
          if (((prev_ix_masked_2 == 0) || (local_150 < prev_ix_masked_2)) || (backward_3 == 0))
          break;
          local_118 = best_len_right_2;
          local_120 = depth_remaining_2;
          if (best_len_right_2 < depth_remaining_2) {
            local_21b0 = best_len_right_2;
          }
          else {
            local_21b0 = depth_remaining_2;
          }
          len_3 = local_21b0;
          local_d0 = local_130 + max_comp_len_2 + local_21b0;
          local_d8 = (ulong *)(local_130 + cur_len_2 + local_21b0);
          matched_3 = local_148 - local_21b0;
          limit2_3 = 0;
          x_3 = (matched_3 >> 3) + 1;
LAB_001584d5:
          x_3 = x_3 - 1;
          if (x_3 != 0) {
            local_90 = local_d8;
            local_98 = (ulong *)(local_d0 + limit2_3);
            if (*local_d8 == *local_98) goto LAB_00158537;
            local_a0 = local_d8;
            local_a8 = (ulong *)(local_d0 + limit2_3);
            iVar4 = 0;
            matching_bits_3 = *local_d8 ^ *local_a8;
            for (uVar5 = matching_bits_3; (uVar5 & 1) == 0; uVar5 = uVar5 >> 1 | 0x8000000000000000)
            {
              iVar4 = iVar4 + 1;
            }
            local_100 = (ulong)iVar4;
            local_c8 = (local_100 >> 3) + limit2_3;
            goto LAB_00158678;
          }
          matched_3 = (matched_3 & 7) + 1;
          while (matched_3 = matched_3 - 1, matched_3 != 0) {
            if (local_d0[limit2_3] != (uint8_t)*local_d8) {
              local_c8 = limit2_3;
              goto LAB_00158678;
            }
            local_d8 = (ulong *)((long)local_d8 + 1);
            limit2_3 = limit2_3 + 1;
          }
          local_c8 = limit2_3;
LAB_00158678:
          local_1d8 = local_21b0 + local_c8;
          if ((cur_ix_masked_3 != 0) && (*local_158 < local_1d8)) {
            *local_158 = local_1d8;
            local_b0 = cur_ix_masked_3;
            *(int *)cur_ix_masked_3 = (int)prev_ix_masked_2;
            *(int *)(cur_ix_masked_3 + 4) = (int)local_1d8 * 0x20;
            cur_ix_masked_3 = cur_ix_masked_3 + 8;
            local_c0 = local_1d8;
            local_b8 = prev_ix_masked_2;
          }
          limit2_3 = local_c8;
          if (_key_2 <= local_1d8) {
            if (buckets_2._4_4_ != 0) {
              local_80 = local_128;
              local_88 = node_left_2;
              *(undefined4 *)((long)&((HasherCommon *)prev_ix_3)->extra + node_right_2 * 4) =
                   *(undefined4 *)
                    (&((HasherCommon *)prev_ix_3)->extra +
                    (node_left_2 & (local_128->_H5).bucket_size_));
              local_50 = local_128;
              local_58 = node_left_2;
              *(undefined4 *)((long)&((HasherCommon *)prev_ix_3)->extra + best_len_left_2 * 4) =
                   *(undefined4 *)
                    ((long)&((HasherCommon *)prev_ix_3)->extra +
                    (node_left_2 & (local_128->_H5).bucket_size_) * 8 + 4);
            }
            goto LAB_001588fc;
          }
          if (local_130[cur_len_2 + local_1d8] < local_130[max_comp_len_2 + local_1d8]) {
            if (buckets_2._4_4_ != 0) {
              *(uint *)((long)&((HasherCommon *)prev_ix_3)->extra + node_right_2 * 4) = uVar1;
            }
            local_40 = local_128;
            local_48 = node_left_2;
            uVar5 = node_left_2 & (local_128->_H5).bucket_size_;
            node_right_2 = uVar5 * 2 + 1;
            uVar1 = *(uint *)((long)&((HasherCommon *)prev_ix_3)->extra + uVar5 * 8 + 4);
            best_len_right_2 = local_1d8;
          }
          else {
            if (buckets_2._4_4_ != 0) {
              *(uint *)((long)&((HasherCommon *)prev_ix_3)->extra + best_len_left_2 * 4) = uVar1;
            }
            local_70 = local_128;
            local_78 = node_left_2;
            uVar5 = node_left_2 & (local_128->_H5).bucket_size_;
            best_len_left_2 = uVar5 * 2;
            uVar1 = *(uint *)(&((HasherCommon *)prev_ix_3)->extra + uVar5);
            depth_remaining_2 = local_1d8;
          }
          backward_3 = backward_3 - 1;
        }
        if (buckets_2._4_4_ != 0) {
          *(int *)((long)&((HasherCommon *)prev_ix_3)->extra + node_right_2 * 4) =
               (local_128->_H5).hash_shift_;
          *(int *)((long)&((HasherCommon *)prev_ix_3)->extra + best_len_left_2 * 4) =
               (local_128->_H5).hash_shift_;
        }
LAB_001588fc:
      }
      while ((num_matches = num_matches - 1, num_matches != 0 &&
             (pos_00 = gap + 1, uVar5 = gap + 4, gap = pos_00, uVar5 < num_bytes))) {
        EvaluateNode(position + sVar7,pos_00,max_backward_limit_00,0,dist_cache,
                     (ZopfliCostModel *)&queue.idx_,(StartPosQueue *)(matches + 0x17f),nodes);
      }
    }
    gap = gap + 1;
  } while( true );
LAB_00156f63:
  local_4c8 = local_4c8 + 1;
  limit2_1 = limit2_1 + 8;
  goto LAB_00156f01;
LAB_00157d09:
  local_2b0 = local_2b0 + 1;
  limit2_2 = limit2_2 + 8;
  goto LAB_00157ca7;
LAB_00158537:
  local_d8 = local_d8 + 1;
  limit2_3 = limit2_3 + 8;
  goto LAB_001584d5;
LAB_00156999:
  local_5f8 = local_5f8 + 1;
  limit2 = limit2 + 8;
  goto LAB_00156937;
}

Assistant:

size_t BrotliZopfliComputeShortestPath(MemoryManager* m, size_t num_bytes,
    size_t position, const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    const int* dist_cache, Hasher* hasher, ZopfliNode* nodes) {
  const size_t stream_offset = params->stream_offset;
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t max_zopfli_len = MaxZopfliLen(params);
  ZopfliCostModel model;
  StartPosQueue queue;
  BackwardMatch matches[2 * (MAX_NUM_MATCHES_H10 + 64)];
  const size_t store_end = num_bytes >= StoreLookaheadH10() ?
      position + num_bytes - StoreLookaheadH10() + 1 : position;
  size_t i;
  size_t gap = 0;
  size_t lz_matches_offset = 0;
  BROTLI_UNUSED(literal_context_lut);
  nodes[0].length = 0;
  nodes[0].u.cost = 0;
  InitZopfliCostModel(m, &model, &params->dist, num_bytes);
  if (BROTLI_IS_OOM(m)) return 0;
  ZopfliCostModelSetFromLiteralCosts(
      &model, position, ringbuffer, ringbuffer_mask);
  InitStartPosQueue(&queue);
  for (i = 0; i + HashTypeLengthH10() - 1 < num_bytes; i++) {
    const size_t pos = position + i;
    const size_t max_distance = BROTLI_MIN(size_t, pos, max_backward_limit);
    const size_t dictionary_start = BROTLI_MIN(size_t,
        pos + stream_offset, max_backward_limit);
    size_t skip;
    size_t num_matches;
    num_matches = FindAllMatchesH10(&hasher->privat._H10,
        &params->dictionary,
        ringbuffer, ringbuffer_mask, pos, num_bytes - i, max_distance,
        dictionary_start + gap, params, &matches[lz_matches_offset]);
    if (num_matches > 0 &&
        BackwardMatchLength(&matches[num_matches - 1]) > max_zopfli_len) {
      matches[0] = matches[num_matches - 1];
      num_matches = 1;
    }
    skip = UpdateNodes(num_bytes, position, i, ringbuffer, ringbuffer_mask,
        params, max_backward_limit, dist_cache, num_matches, matches, &model,
        &queue, nodes);
    if (skip < BROTLI_LONG_COPY_QUICK_STEP) skip = 0;
    if (num_matches == 1 && BackwardMatchLength(&matches[0]) > max_zopfli_len) {
      skip = BROTLI_MAX(size_t, BackwardMatchLength(&matches[0]), skip);
    }
    if (skip > 1) {
      /* Add the tail of the copy to the hasher. */
      StoreRangeH10(&hasher->privat._H10,
          ringbuffer, ringbuffer_mask, pos + 1, BROTLI_MIN(
          size_t, pos + skip, store_end));
      skip--;
      while (skip) {
        i++;
        if (i + HashTypeLengthH10() - 1 >= num_bytes) break;
        EvaluateNode(position + stream_offset, i, max_backward_limit, gap,
            dist_cache, &model, &queue, nodes);
        skip--;
      }
    }
  }
  CleanupZopfliCostModel(m, &model);
  return ComputeShortestPathFromNodes(num_bytes, nodes);
}